

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O2

void pair1_sock_close(void *arg)

{
  int iVar1;
  nni_aio *aio;
  nni_msg *local_40;
  nni_msg *m;
  
  m = (nni_msg *)((long)arg + 0x20);
  nni_mtx_lock((nni_mtx *)m);
  do {
    aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0xf0));
    if (aio == (nni_aio *)0x0) {
      aio = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x90));
      if (aio == (nni_aio *)0x0) {
        do {
          iVar1 = nni_lmq_get((nni_lmq *)((long)arg + 0xa8),&local_40);
          if (iVar1 != 0) {
            iVar1 = nni_lmq_get((nni_lmq *)((long)arg + 0x48),&local_40);
            if (iVar1 != 0) {
              nni_mtx_unlock((nni_mtx *)m);
              return;
            }
          }
          nni_msg_free(local_40);
        } while( true );
      }
    }
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,NNG_ECLOSED);
  } while( true );
}

Assistant:

static void
pair1_sock_close(void *arg)
{
	pair1_sock *s = arg;
	nni_aio    *a;
	nni_msg    *m;
	nni_mtx_lock(&s->mtx);
	while (((a = nni_list_first(&s->raq)) != NULL) ||
	    ((a = nni_list_first(&s->waq)) != NULL)) {
		nni_aio_list_remove(a);
		nni_aio_finish_error(a, NNG_ECLOSED);
	}
	while ((nni_lmq_get(&s->rmq, &m) == 0) ||
	    (nni_lmq_get(&s->wmq, &m) == 0)) {
		nni_msg_free(m);
	}
	nni_mtx_unlock(&s->mtx);
}